

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall
Catch::TextFlow::Columns::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  ulong uVar1;
  pointer piVar2;
  pointer pCVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  string padding;
  string col;
  undefined1 *local_78;
  ulong local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  pCVar3 = (this->m_columns->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_columns->
      super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>)._M_impl
      .super__Vector_impl_data._M_finish != pCVar3) {
    lVar4 = 0;
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar1 = *(ulong *)((long)&pCVar3->m_width + lVar5);
      piVar2 = (this->m_iterators).
               super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((*(long *)((long)&piVar2->m_pos + lVar4) ==
           *(long *)((long)&(pCVar3->m_string)._M_string_length + lVar5)) &&
         ((long)&(pCVar3->m_string)._M_dataplus._M_p + lVar5 ==
          *(long *)((long)&piVar2->m_column + lVar4))) {
        std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,(char)uVar1);
      }
      else {
        Column::iterator::operator*[abi_cxx11_
                  (&local_50,(iterator *)((long)&piVar2->m_column + lVar4));
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        local_70 = 0;
        *local_78 = 0;
        if (local_50._M_string_length <= uVar1 && uVar1 - local_50._M_string_length != 0) {
          std::__cxx11::string::_M_replace_aux
                    ((ulong)&local_78,0,0,(char)(uVar1 - local_50._M_string_length));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      uVar6 = uVar6 + 1;
      pCVar3 = (this->m_columns->
               super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x38;
      lVar4 = lVar4 + 0x28;
    } while (uVar6 < (ulong)(((long)(this->m_columns->
                                    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Columns::iterator::operator*() const {
            std::string row, padding;

            for (size_t i = 0; i < m_columns.size(); ++i) {
                const auto width = m_columns[i].width();
                if (m_iterators[i] != m_columns[i].end()) {
                    std::string col = *m_iterators[i];
                    row += padding;
                    row += col;

                    padding.clear();
                    if (col.size() < width) {
                        padding.append(width - col.size(), ' ');
                    }
                }
                else {
                    padding.append(width, ' ');
                }
            }
            return row;
        }